

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

void __thiscall
simple_thread_pool::ThreadPoolMgr::registerThreadId
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  pthread_t pVar1;
  __hashtable *__h;
  pthread_t local_38;
  __shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pVar1 = pthread_self();
  std::mutex::lock(&this->threadIdsLock);
  local_38 = pVar1;
  std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &t_handle->
              super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>);
  std::
  _Hashtable<std::thread::id,std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
            ((_Hashtable<std::thread::id,std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<std::thread::id_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->threadIds,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->threadIdsLock);
  return;
}

Assistant:

void registerThreadId(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::thread::id tid = std::this_thread::get_id();

        std::lock_guard<std::mutex> l(threadIdsLock);
        threadIds.insert({tid, t_handle});
    }